

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus readBasisFile(HighsLogOptions *log_options,HighsBasis *basis,string *filename)

{
  char cVar1;
  HighsStatus HVar2;
  ifstream in_file;
  
  std::ifstream::ifstream(&in_file);
  std::ifstream::open((char *)&in_file,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    highsLogUser(log_options,kError,"readBasisFile: Cannot open readable file \"%s\"\n",
                 (filename->_M_dataplus)._M_p);
    HVar2 = kError;
  }
  else {
    HVar2 = readBasisStream(log_options,basis,&in_file);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&in_file);
  return HVar2;
}

Assistant:

HighsStatus readBasisFile(const HighsLogOptions& log_options, HighsBasis& basis,
                          const std::string filename) {
  // Opens a basis file as an ifstream
  HighsStatus return_status = HighsStatus::kOk;
  std::ifstream in_file;
  in_file.open(filename.c_str(), std::ios::in);
  if (in_file.is_open()) {
    return_status = readBasisStream(log_options, basis, in_file);
    in_file.close();
  } else {
    highsLogUser(log_options, HighsLogType::kError,
                 "readBasisFile: Cannot open readable file \"%s\"\n",
                 filename.c_str());
    return_status = HighsStatus::kError;
  }
  return return_status;
}